

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_avx2.c
# Opt level: O0

void av1_lowbd_fwd_txfm_avx2
               (int16_t *src_diff,tran_low_t *coeff,int diff_stride,TxfmParam *txfm_param)

{
  undefined1 *in_RCX;
  undefined4 in_EDX;
  int16_t *in_RSI;
  undefined8 in_RDI;
  FwdTxfm2dFunc fwd_txfm2d_func;
  undefined4 in_stack_ffffffffffffffe8;
  
  if ((*(int *)(in_RCX + 4) == 0) || (in_RCX[1] != '\0')) {
    (*(code *)fwd_txfm2d_func_ls[(byte)in_RCX[1]])
              (in_RDI,in_RSI,in_EDX,*in_RCX,*(undefined4 *)(in_RCX + 8));
  }
  else {
    av1_lowbd_fwd_txfm_c
              (in_RSI,(tran_low_t *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
               (int)((ulong)in_RCX >> 0x20),(TxfmParam *)fwd_txfm2d_func_ls[(byte)in_RCX[1]]);
  }
  return;
}

Assistant:

void av1_lowbd_fwd_txfm_avx2(const int16_t *src_diff, tran_low_t *coeff,
                             int diff_stride, TxfmParam *txfm_param) {
  FwdTxfm2dFunc fwd_txfm2d_func = fwd_txfm2d_func_ls[txfm_param->tx_size];
  if (txfm_param->lossless && txfm_param->tx_size == TX_4X4) {
    av1_lowbd_fwd_txfm_c(src_diff, coeff, diff_stride, txfm_param);
  } else {
    fwd_txfm2d_func(src_diff, coeff, diff_stride, txfm_param->tx_type,
                    txfm_param->bd);
  }
}